

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O2

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,Def *def)

{
  undefined1 *puVar1;
  int iVar2;
  Type *pTVar3;
  ostream *poVar4;
  CompoundStatement *pCVar5;
  Class *pCVar6;
  string sStack_48;
  
  print_indentation(this);
  pTVar3 = Def::getReturnType(def);
  (**(pTVar3->super_ASTNode)._vptr_ASTNode)(pTVar3,this);
  puVar1 = &this->field_0x20;
  poVar4 = std::operator<<((ostream *)puVar1," ");
  Def::getUniqueCppName_abi_cxx11_(&sStack_48,def);
  poVar4 = std::operator<<(poVar4,(string *)&sStack_48);
  std::operator<<(poVar4,"(");
  std::__cxx11::string::~string((string *)&sStack_48);
  generateDefParameters(this,def);
  std::operator<<((ostream *)puVar1,") {\n");
  this->n_spaces = this->n_spaces + 1;
  generateDefLocalVariables(this,def);
  this->tmpCounter = 0;
  pCVar5 = Def::getStatements(def);
  (**(pCVar5->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar5,this);
  this->n_spaces = this->n_spaces + -1;
  print_indentation(this);
  std::operator<<((ostream *)puVar1,"}\n\n");
  Def::getName_abi_cxx11_(&sStack_48,def);
  iVar2 = std::__cxx11::string::compare((char *)&sStack_48);
  if (iVar2 == 0) {
    pCVar6 = Def::getClass(def);
    std::__cxx11::string::~string((string *)&sStack_48);
    if (pCVar6 == (Class *)0x0) {
      this->mainDef = def;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

void CppPrinter::visit(Def* def) {
    print_indentation();
    def->getReturnType()->accept(this);
    output << " " << def->getUniqueCppName() << "(";

    generateDefParameters(def);
    output << ") {\n";

    indent();

    generateDefLocalVariables(def);

    tmpCounter = 0;
    def->getStatements()->accept(this);
    dedent();
    print_indentation();
    output << "}\n\n";

    if (def->getName().compare("main") == 0 && def->getClass() == nullptr) {
        mainDef = def;
    }
}